

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O1

vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
* __thiscall
SudokuGitter::getQuad
          (vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
           *__return_storage_ptr__,SudokuGitter *this,uint hoehenIndex,uint breitenInxted)

{
  vector<cell*,std::allocator<cell*>> *this_00;
  uint uVar1;
  uint uVar2;
  iterator __position;
  ulong uVar3;
  ulong local_50;
  vector<cell_*,_std::allocator<cell_*>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = this->quadHeight;
  if (uVar1 != 0) {
    uVar2 = this->quadWidth;
    local_50 = 0;
    do {
      local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<cell*,std::allocator<cell*>>,std::allocator<std::vector<cell*,std::allocator<cell*>>>>
      ::emplace_back<std::vector<cell*,std::allocator<cell*>>>
                ((vector<std::vector<cell*,std::allocator<cell*>>,std::allocator<std::vector<cell*,std::allocator<cell*>>>>
                  *)__return_storage_ptr__,&local_48);
      if (local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (this->quadWidth != 0) {
        uVar3 = 0;
        do {
          this_00 = (vector<cell*,std::allocator<cell*>> *)
                    ((__return_storage_ptr__->
                     super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_50);
          local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)(breitenInxted * uVar2 + (int)uVar3) * 8 +
                        *(long *)&(this->cells).
                                  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [uVar1 * hoehenIndex + (int)local_50].
                                  super__Vector_base<cell,_std::allocator<cell>_>._M_impl);
          __position._M_current = *(cell ***)(this_00 + 8);
          if (__position._M_current == *(cell ***)(this_00 + 0x10)) {
            std::vector<cell*,std::allocator<cell*>>::_M_realloc_insert<cell*>
                      (this_00,__position,(cell **)&local_48);
          }
          else {
            *__position._M_current =
                 (cell *)local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->quadWidth);
      }
      local_50 = local_50 + 1;
    } while (local_50 < this->quadHeight);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<cell *>> SudokuGitter::getQuad(unsigned int hoehenIndex, unsigned int breitenInxted) {
    vector<vector<cell *>> result = vector<vector<cell *>>();

    unsigned int startHeightIndex = quadHeight * hoehenIndex;
    unsigned int startWidthIndex = quadWidth * breitenInxted;

    for (int heightIndex = 0; heightIndex < quadHeight; heightIndex++) {
        result.push_back(vector<cell *>());
        for (int widthIndex = 0; widthIndex < quadWidth; widthIndex++) {
            result[heightIndex].push_back(&cells[heightIndex + startHeightIndex][widthIndex + startWidthIndex]);
        }
    }

    return result;
}